

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::RelativePath(string *__return_storage_ptr__,string *local,string *remote)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(local);
  if (!bVar1) {
    std::operator+(&local_40,"RelativePath must be passed a full path to local: ",local);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar1 = cmsys::SystemTools::FileIsFullPath(remote);
  if (!bVar1) {
    std::operator+(&local_40,"RelativePath must be passed a full path to remote: ",remote);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  cmsys::SystemTools::RelativePath(__return_storage_ptr__,local,remote);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::RelativePath(std::string const& local,
                                        std::string const& remote)
{
  if (!cmSystemTools::FileIsFullPath(local)) {
    cmSystemTools::Error("RelativePath must be passed a full path to local: " +
                         local);
  }
  if (!cmSystemTools::FileIsFullPath(remote)) {
    cmSystemTools::Error(
      "RelativePath must be passed a full path to remote: " + remote);
  }
  return cmsys::SystemTools::RelativePath(local, remote);
}